

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3raster.cpp
# Opt level: O1

uint32 rw::gl3::getSizeNativeTexture(Texture *tex)

{
  Raster *pRVar1;
  int32 iVar2;
  int32 iVar3;
  uint32 uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  
  iVar2 = Raster::getNumLevels(tex->raster);
  if (iVar2 < 1) {
    uVar4 = 0x74;
  }
  else {
    pRVar1 = tex->raster;
    uVar4 = 0x74;
    iVar7 = 0;
    do {
      uVar8 = pRVar1->originalHeight;
      iVar3 = pRVar1->originalStride;
      if (iVar7 != 0) {
        uVar5 = pRVar1->originalWidth;
        iVar6 = iVar7;
        do {
          if (1 < (int)uVar5) {
            uVar5 = uVar5 >> 1;
            iVar3 = iVar3 / 2;
          }
          uVar8 = uVar8 >> (1 < (int)uVar8);
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      uVar4 = uVar4 + uVar8 * iVar3 + 4;
      iVar7 = iVar7 + 1;
    } while (iVar7 != iVar2);
  }
  return uVar4;
}

Assistant:

uint32
getSizeNativeTexture(Texture *tex)
{
	uint32 size = 12 + 72 + 32;
	int32 levels = tex->raster->getNumLevels();
	for(int32 i = 0; i < levels; i++)
		size += 4 + getLevelSize(tex->raster, i);
	return size;
}